

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O1

int __thiscall loader::context_t::init(context_t *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppzVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  logger *this_00;
  pointer pcVar4;
  source_loc loc;
  undefined1 auVar5 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  void *pvVar10;
  long *plVar11;
  ulong uVar12;
  code *pcVar13;
  char *pcVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined4 *puVar17;
  iterator iVar18;
  pointer pbVar19;
  driver_vector_t *pdVar20;
  pointer pdVar21;
  long lVar22;
  bool bVar23;
  byte bVar24;
  string_view_t fmt;
  string message;
  string tracingLayerLibraryPath;
  string loadLibraryErrorValue;
  string loaderLibraryPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  discoveredDrivers;
  link_map *dlinfo_map;
  string local_4a8;
  undefined1 local_488 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478 [4];
  string local_438;
  allocator local_411;
  undefined1 *local_410;
  char *local_408;
  undefined1 local_400;
  undefined7 uStack_3ff;
  long *local_3f0 [2];
  long local_3e0 [2];
  driver_vector_t *local_3d0;
  char *local_3c8;
  long local_3c0;
  char local_3b8;
  undefined7 uStack_3b7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  undefined1 *local_390;
  long local_388;
  undefined1 local_380;
  undefined7 uStack_37f;
  driver_vector_t *local_370;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  driver_vector_t *local_2e8;
  pointer local_2e0;
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long local_218;
  long *local_210 [2];
  long local_200 [2];
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar24 = 0;
  if (this->driverEnvironmentQueried != false) {
    return 0;
  }
  pcVar8 = getenv("ZE_ENABLE_LOADER_DEBUG_TRACE");
  if ((pcVar8 == (char *)0x0) || (iVar7 = strcmp("0",pcVar8), iVar7 == 0)) {
    bVar23 = false;
  }
  else {
    iVar7 = strcmp("1",pcVar8);
    bVar23 = iVar7 == 0;
  }
  this->debugTraceEnabled = bVar23;
  discoverEnabledDrivers_abi_cxx11_();
  local_410 = &local_400;
  local_408 = (char *)0x0;
  local_400 = 0;
  createLogger();
  p_Var6 = p_Stack_480;
  auVar5 = local_488;
  local_488 = (undefined1  [8])0x0;
  p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar5;
  (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var6;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (p_Stack_480 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_480);
  }
  pcVar8 = getenv("ZEL_LOADER_LOGGING_LEVEL");
  local_488 = (undefined1  [8])local_478;
  if (pcVar8 == (char *)0x0) {
    p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_478[0]._M_allocated_capacity = local_478[0]._M_allocated_capacity & 0xffffffffffffff00;
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,pcVar8,pcVar8 + sVar9);
  }
  iVar7 = std::__cxx11::string::compare(local_488);
  if (iVar7 == 0) {
    bVar23 = this->debugTraceEnabled;
    if (local_488 != (undefined1  [8])local_478) {
      operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
    }
    if (bVar23 == false) {
      this->debugTraceEnabled = true;
      ((this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      log_to_console = false;
    }
  }
  else if (local_488 != (undefined1  [8])local_478) {
    operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
  }
  peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3->logging_enabled == true) {
    this_00 = (peVar3->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    p_Var2 = (peVar3->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    local_3c8 = (char *)CONCAT44(local_3c8._4_4_,1);
    local_390 = (undefined1 *)CONCAT44(local_390._4_4_,0x16);
    local_438._M_dataplus._M_p = local_438._M_dataplus._M_p & 0xffffffff00000000;
    local_488 = (undefined1  [8])0x0;
    p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_478[0]._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x1a;
    fmt.data_ = "Loader Version {}.{}.{} {}";
    spdlog::logger::log_<int,int,int,char_const(&)[41]>
              (this_00,loc,info,fmt,(int *)&local_3c8,(int *)&local_390,(int *)&local_438,
               (char (*) [41])"c1872469737f807abc0ab8c4b35a263a568a6504");
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  add_loader_version(this);
  local_3c8 = &local_3b8;
  local_3c0 = 0;
  local_3b8 = '\0';
  pcVar8 = getenv("ZEL_LIBRARY_PATH");
  local_390 = &local_380;
  if (pcVar8 == (char *)0x0) {
    local_388 = 0;
    local_380 = 0;
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,pcVar8,pcVar8 + sVar9);
  }
  if (local_388 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_3c8);
  }
  if (this->debugTraceEnabled == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Using Loader Library Path: ","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_3c8,local_3c8 + local_3c0);
    debug_trace_message(this,&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pdVar20 = &this->zeDrivers;
  lVar22 = (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = getenv("ZE_ENABLE_NULL_DRIVER");
  if ((pcVar8 == (char *)0x0) || (iVar7 = strcmp("0",pcVar8), iVar7 == 0)) {
    uVar12 = 0;
  }
  else {
    iVar7 = strcmp("1",pcVar8);
    uVar12 = (ulong)(iVar7 == 0);
  }
  std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
            (pdVar20,uVar12 + (lVar22 >> 5));
  local_370 = &this->zesDrivers;
  lVar22 = (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = getenv("ZE_ENABLE_NULL_DRIVER");
  if ((pcVar8 == (char *)0x0) || (iVar7 = strcmp("0",pcVar8), iVar7 == 0)) {
    uVar12 = 0;
  }
  else {
    iVar7 = strcmp("1",pcVar8);
    uVar12 = (ulong)(iVar7 == 0);
  }
  std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
            (local_370,uVar12 + (lVar22 >> 5));
  local_3d0 = &this->allDrivers;
  lVar22 = (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_3a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pcVar8 = getenv("ZE_ENABLE_NULL_DRIVER");
  if ((pcVar8 == (char *)0x0) || (iVar7 = strcmp("0",pcVar8), iVar7 == 0)) {
    uVar12 = 0;
  }
  else {
    iVar7 = strcmp("1",pcVar8);
    uVar12 = (ulong)(iVar7 == 0);
  }
  std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::reserve
            (local_3d0,uVar12 + (lVar22 >> 5));
  pcVar8 = getenv("ZE_ENABLE_NULL_DRIVER");
  if (((pcVar8 != (char *)0x0) && (iVar7 = strcmp("0",pcVar8), iVar7 != 0)) &&
     (iVar7 = strcmp("1",pcVar8), iVar7 == 0)) {
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Enabling Null Driver","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    if (local_210[0] != local_200) {
      operator_delete(local_210[0],local_200[0] + 1);
    }
    create_library_path_abi_cxx11_((string *)local_488,"libze_null.so.1",local_3c8);
    pvVar10 = (void *)dlopen(local_488);
    if (local_488 != (undefined1  [8])local_478) {
      operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
    }
    if (this->debugTraceEnabled == true) {
      local_488 = (undefined1  [8])local_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"ze_null Driver Init","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_488,
                 (char *)((long)local_488 + (long)&p_Stack_480->_vptr__Sp_counted_base));
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
      debug_trace_message(this,&local_90,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
      }
    }
    if (pvVar10 == (void *)0x0) {
      if (this->debugTraceEnabled == true) {
        pcVar14 = (char *)dlerror();
        pcVar8 = local_408;
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)&local_410,0,pcVar8,(ulong)pcVar14);
        create_library_path_abi_cxx11_(&local_4a8,"libze_null.so.1",local_3c8);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0x1cdcb8);
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_438.field_2._M_allocated_capacity = *psVar15;
          local_438.field_2._8_8_ = plVar11[3];
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        }
        else {
          local_438.field_2._M_allocated_capacity = *psVar15;
          local_438._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_438._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_438);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar16) {
          local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_478[0]._8_8_ = plVar11[3];
          local_488 = (undefined1  [8])local_478;
        }
        else {
          local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_488 = (undefined1  [8])*plVar11;
        }
        p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
        *plVar11 = (long)paVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_488,
                   (char *)((long)local_488 + (long)&p_Stack_480->_vptr__Sp_counted_base));
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_410,local_408 + (long)local_410);
        debug_trace_message(this,&local_d0,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_408 = (char *)0x0;
        *local_410 = 0;
        if (local_488 != (undefined1  [8])local_478) {
          operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
        }
      }
    }
    else {
      std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>(local_3d0);
      (this->allDrivers).super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].handle = pvVar10;
      pdVar21 = (this->allDrivers).
                super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_replace
                ((ulong)&pdVar21[-1].name,0,(char *)pdVar21[-1].name._M_string_length,0x1cdcb0);
    }
  }
  local_2e0 = local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8 = pdVar20;
  if (local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_3a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar16 = &local_438.field_2;
    pbVar19 = local_3a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pdVar20 = local_3d0;
    do {
      local_488 = (undefined1  [8])local_478;
      pcVar4 = (pbVar19->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_488,pcVar4,pcVar4 + pbVar19->_M_string_length);
      pvVar10 = (void *)dlopen(local_488);
      if (pvVar10 == (void *)0x0) {
        if (this->debugTraceEnabled != false) {
          pcVar14 = (char *)dlerror();
          pcVar8 = local_408;
          strlen(pcVar14);
          pdVar20 = local_3d0;
          std::__cxx11::string::_M_replace((ulong)&local_410,0,pcVar8,(ulong)pcVar14);
          std::operator+(&local_4a8,"Load Library of ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a8);
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_438.field_2._M_allocated_capacity = *psVar15;
            local_438.field_2._8_8_ = plVar11[3];
            local_438._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_438.field_2._M_allocated_capacity = *psVar15;
            local_438._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_438._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_368,local_438._M_dataplus._M_p,
                     local_438._M_dataplus._M_p + local_438._M_string_length);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_410,local_408 + (long)local_410);
          debug_trace_message(this,&local_368,&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          local_408 = (char *)0x0;
          *local_410 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != paVar16) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if (this->debugTraceEnabled != false) {
          std::operator+(&local_4a8,"Loading Driver ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_488);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a8);
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_438.field_2._M_allocated_capacity = *psVar15;
            local_438.field_2._8_8_ = plVar11[3];
            local_438._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_438.field_2._M_allocated_capacity = *psVar15;
            local_438._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_438._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          iVar7 = dlinfo(pvVar10,2,&local_218);
          if (iVar7 == 0) {
            std::__cxx11::string::string((string *)local_3f0,*(char **)(local_218 + 8),&local_411);
            plVar11 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1cdcd9)
            ;
            local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_4a8.field_2._M_allocated_capacity = *psVar15;
              local_4a8.field_2._8_8_ = plVar11[3];
            }
            else {
              local_4a8.field_2._M_allocated_capacity = *psVar15;
              local_4a8._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_4a8._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_438,(ulong)local_4a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
              operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_3f0[0] != local_3e0) {
              operator_delete(local_3f0[0],local_3e0[0] + 1);
            }
          }
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_348,local_438._M_dataplus._M_p,
                     local_438._M_dataplus._M_p + local_438._M_string_length);
          local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
          debug_trace_message(this,&local_348,&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != &local_308.field_2) {
            operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != paVar16) {
            operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
          }
        }
        std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::emplace_back<>(pdVar20);
        (this->allDrivers).super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].handle = pvVar10;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->allDrivers).
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].name);
      }
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
      }
      pbVar19 = pbVar19 + 1;
    } while (pbVar19 != local_2e0);
  }
  pdVar20 = local_2e8;
  pdVar21 = (this->allDrivers).
            super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = (long)(this->allDrivers).
                 super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar21;
  if (uVar12 == 0) {
    if (this->debugTraceEnabled == true) {
      local_488 = (undefined1  [8])local_478;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"0 Drivers Discovered","")
      ;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_488,
                 (char *)((long)local_488 + (long)&p_Stack_480->_vptr__Sp_counted_base));
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
      debug_trace_message(this,&local_110,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
      }
    }
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"0 Drivers Discovered","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    iVar7 = 0x78000001;
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
    goto LAB_00183ade;
  }
  if (0 < (long)uVar12) {
    lVar22 = uVar12 / 0xd98 + 1;
    do {
      std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::push_back(pdVar20,pdVar21);
      pdVar21 = pdVar21 + 1;
      lVar22 = lVar22 + -1;
    } while (1 < lVar22);
  }
  pdVar21 = (this->allDrivers).
            super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = (long)(this->allDrivers).
                 super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar21;
  if (0 < (long)uVar12) {
    lVar22 = uVar12 / 0xd98 + 1;
    do {
      std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::push_back(local_370,pdVar21)
      ;
      pdVar21 = pdVar21 + 1;
      lVar22 = lVar22 + -1;
    } while (1 < lVar22);
  }
  pcVar8 = getenv("ZE_ENABLE_VALIDATION_LAYER");
  if (((pcVar8 != (char *)0x0) && (iVar7 = strcmp("0",pcVar8), iVar7 != 0)) &&
     (iVar7 = strcmp("1",pcVar8), iVar7 == 0)) {
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_258,"Validation Layer Enabled","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    if (local_258[0] != local_248) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
    create_library_path_abi_cxx11_(&local_438,"libze_validation_layer.so.1",local_3c8);
    pvVar10 = (void *)dlopen(local_438._M_dataplus._M_p);
    this->validationLayer = pvVar10;
    if (pvVar10 == (void *)0x0) {
      if (this->debugTraceEnabled == true) {
        pcVar14 = (char *)dlerror();
        pcVar8 = local_408;
        strlen(pcVar14);
        std::__cxx11::string::_M_replace((ulong)&local_410,0,pcVar8,(ulong)pcVar14);
        local_3f0[0] = local_3e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3f0,"libze_validation_layer.so.1","");
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1cdcb8);
        psVar15 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_4a8.field_2._M_allocated_capacity = *psVar15;
          local_4a8.field_2._8_8_ = plVar11[3];
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        }
        else {
          local_4a8.field_2._M_allocated_capacity = *psVar15;
          local_4a8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_4a8._M_string_length = plVar11[1];
        *plVar11 = (long)psVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a8);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar16) {
          local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_478[0]._8_8_ = plVar11[3];
          local_488 = (undefined1  [8])local_478;
        }
        else {
          local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_488 = (undefined1  [8])*plVar11;
        }
        p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
        *plVar11 = (long)paVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if (local_3f0[0] != local_3e0) {
          operator_delete(local_3f0[0],local_3e0[0] + 1);
        }
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_488,
                   (char *)((long)local_488 + (long)&p_Stack_480->_vptr__Sp_counted_base));
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_410,local_408 + (long)local_410);
        debug_trace_message(this,&local_150,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        local_408 = (char *)0x0;
        *local_410 = 0;
        if (local_488 != (undefined1  [8])local_478) {
          operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
        }
      }
    }
    else {
      pcVar13 = (code *)dlsym(pvVar10,"zelLoaderGetVersion");
      if ((pcVar13 != (code *)0x0) && (iVar7 = (*pcVar13)(local_488), iVar7 == 0)) {
        iVar18._M_current =
             (this->compVersions).
             super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar18._M_current ==
            (this->compVersions).
            super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<zel_component_version,std::allocator<zel_component_version>>::
          _M_realloc_insert<zel_component_version_const&>
                    ((vector<zel_component_version,std::allocator<zel_component_version>> *)
                     &this->compVersions,iVar18,(zel_component_version *)local_488);
        }
        else {
          puVar17 = (undefined4 *)local_488;
          for (lVar22 = 0x14; lVar22 != 0; lVar22 = lVar22 + -1) {
            *(undefined4 *)(iVar18._M_current)->component_name = *puVar17;
            puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
            iVar18._M_current = iVar18._M_current + (ulong)bVar24 * -8 + 4;
          }
          ppzVar1 = &(this->compVersions).
                     super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppzVar1 = *ppzVar1 + 1;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar8 = getenv("ZE_ENABLE_TRACING_LAYER");
  if (((pcVar8 != (char *)0x0) && (iVar7 = strcmp("0",pcVar8), iVar7 != 0)) &&
     (iVar7 = strcmp("1",pcVar8), iVar7 == 0)) {
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_278[0] = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Tracing Layer Enabled","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    if (local_278[0] != local_268) {
      operator_delete(local_278[0],local_268[0] + 1);
    }
    this->tracingLayerEnabled = true;
  }
  create_library_path_abi_cxx11_(&local_438,"libze_tracing_layer.so.1",local_3c8);
  if (this->debugTraceEnabled == true) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Tracing Layer Library Path: ","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_438._M_dataplus._M_p,
               local_438._M_dataplus._M_p + local_438._M_string_length);
    debug_trace_message(this,&local_190,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  pvVar10 = (void *)dlopen(local_438._M_dataplus._M_p);
  this->tracingLayer = pvVar10;
  if (pvVar10 == (void *)0x0) {
    if (this->debugTraceEnabled == true) {
      pcVar14 = (char *)dlerror();
      pcVar8 = local_408;
      strlen(pcVar14);
      std::__cxx11::string::_M_replace((ulong)&local_410,0,pcVar8,(ulong)pcVar14);
      local_3f0[0] = local_3e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f0,"libze_tracing_layer.so.1","");
      plVar11 = (long *)std::__cxx11::string::replace((ulong)local_3f0,0,(char *)0x0,0x1cdcb8);
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_4a8.field_2._M_allocated_capacity = *psVar15;
        local_4a8.field_2._8_8_ = plVar11[3];
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      }
      else {
        local_4a8.field_2._M_allocated_capacity = *psVar15;
        local_4a8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_4a8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_4a8);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar16) {
        local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
        local_478[0]._8_8_ = plVar11[3];
        local_488 = (undefined1  [8])local_478;
      }
      else {
        local_478[0]._0_8_ = paVar16->_M_allocated_capacity;
        local_488 = (undefined1  [8])*plVar11;
      }
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
      *plVar11 = (long)paVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if (local_3f0[0] != local_3e0) {
        operator_delete(local_3f0[0],local_3e0[0] + 1);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_488,
                 (char *)((long)local_488 + (long)&p_Stack_480->_vptr__Sp_counted_base));
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_410,local_408 + (long)local_410);
      debug_trace_message(this,&local_1d0,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      local_408 = (char *)0x0;
      *local_410 = 0;
      if (local_488 != (undefined1  [8])local_478) {
        operator_delete((void *)local_488,local_478[0]._M_allocated_capacity + 1);
      }
    }
  }
  else {
    pcVar13 = (code *)dlsym(pvVar10,"zelLoaderGetVersion");
    if ((pcVar13 != (code *)0x0) && (iVar7 = (*pcVar13)(local_488), iVar7 == 0)) {
      iVar18._M_current =
           (this->compVersions).
           super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar18._M_current ==
          (this->compVersions).
          super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<zel_component_version,std::allocator<zel_component_version>>::
        _M_realloc_insert<zel_component_version_const&>
                  ((vector<zel_component_version,std::allocator<zel_component_version>> *)
                   &this->compVersions,iVar18,(zel_component_version *)local_488);
      }
      else {
        puVar17 = (undefined4 *)local_488;
        for (lVar22 = 0x14; lVar22 != 0; lVar22 = lVar22 + -1) {
          *(undefined4 *)(iVar18._M_current)->component_name = *puVar17;
          puVar17 = puVar17 + (ulong)bVar24 * -2 + 1;
          iVar18._M_current = iVar18._M_current + (ulong)bVar24 * -8 + 4;
        }
        ppzVar1 = &(this->compVersions).
                   super__Vector_base<zel_component_version,_std::allocator<zel_component_version>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppzVar1 = *ppzVar1 + 1;
      }
    }
  }
  pcVar8 = getenv("ZET_ENABLE_API_TRACING_EXP");
  if (((pcVar8 != (char *)0x0) && (iVar7 = strcmp("0",pcVar8), iVar7 != 0)) &&
     (iVar7 = strcmp("1",pcVar8), iVar7 == 0)) {
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,
               "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    if (local_298[0] != local_288) {
      operator_delete(local_298[0],local_288[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  pcVar8 = getenv("ZE_ENABLE_LOADER_INTERCEPT");
  if ((pcVar8 == (char *)0x0) || (iVar7 = strcmp("0",pcVar8), iVar7 == 0)) {
    this->forceIntercept = false;
    this->sysmanInstanceDrivers = pdVar20;
LAB_00183954:
    if (1 < (ulong)(((long)(this->allDrivers).
                           super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->allDrivers).
                           super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x7aff6957aff6957b))
    goto LAB_0018397e;
  }
  else {
    iVar7 = strcmp("1",pcVar8);
    this->forceIntercept = iVar7 == 0;
    this->sysmanInstanceDrivers = pdVar20;
    if (iVar7 != 0) goto LAB_00183954;
LAB_0018397e:
    this->intercept_enabled = true;
    peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Intercept Enabled","");
    if (peVar3->logging_enabled == true) {
      local_488 = (undefined1  [8])0x0;
      p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_478[0]._M_allocated_capacity = 0;
      spdlog::logger::log((peVar3->_logger).
                          super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0)
      ;
    }
    if (local_2b8[0] != local_2a8) {
      operator_delete(local_2b8[0],local_2a8[0] + 1);
    }
  }
  this->driverEnvironmentQueried = true;
  peVar3 = (this->zel_logger).super___shared_ptr<loader::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"zeInit succeeded","");
  if (peVar3->logging_enabled == true) {
    local_488 = (undefined1  [8])0x0;
    p_Stack_480 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_478[0]._M_allocated_capacity = 0;
    spdlog::logger::log((peVar3->_logger).
                        super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0.0);
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  iVar7 = 0;
LAB_00183ade:
  if (local_390 != &local_380) {
    operator_delete(local_390,CONCAT71(uStack_37f,local_380) + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,CONCAT71(uStack_3ff,local_400) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a8);
  return iVar7;
}

Assistant:

ze_result_t context_t::init()
    {
        if (driverEnvironmentQueried) {
            return ZE_RESULT_SUCCESS;
        }
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
        auto discoveredDrivers = discoverEnabledDrivers();
        std::string loadLibraryErrorValue;

        zel_logger = createLogger();

        if ((getenv_string("ZEL_LOADER_LOGGING_LEVEL") == "trace") && !debugTraceEnabled) {
            debugTraceEnabled = true;
            zel_logger->log_to_console = false;
        }

        if (zel_logger->logging_enabled)
            zel_logger->get_base_logger()->info("Loader Version {}.{}.{} {}", LOADER_VERSION_MAJOR, LOADER_VERSION_MINOR, LOADER_VERSION_PATCH, LOADER_VERSION_SHA);

        add_loader_version();
        std::string loaderLibraryPath;
        auto loaderLibraryPathEnv = getenv_string("ZEL_LIBRARY_PATH");
        if (!loaderLibraryPathEnv.empty()) {
            loaderLibraryPath = loaderLibraryPathEnv;
        }
#ifdef _WIN32
        else {
            loaderLibraryPath = readLevelZeroLoaderLibraryPath();
        }
#endif
        if (debugTraceEnabled)
            debug_trace_message("Using Loader Library Path: ", loaderLibraryPath);

        // To allow for two different sets of drivers to be in use between sysman and core/tools, we use and store the drivers in two vectors.
        // alldrivers stores all the drivers for cleanup when the library exits.
        zeDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        zesDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        allDrivers.reserve( discoveredDrivers.size() + getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) );
        if( getenv_tobool( "ZE_ENABLE_NULL_DRIVER" ) )
        {
            zel_logger->log_info("Enabling Null Driver");
            auto handle = LOAD_DRIVER_LIBRARY( create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()).c_str());
            if (debugTraceEnabled) {
                std::string message = "ze_null Driver Init";
                debug_trace_message(message, "");
            }
            if( NULL != handle )
            {
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = "ze_null";
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + create_library_path( MAKE_LIBRARY_NAME( "ze_null", L0_LOADER_VERSION ), loaderLibraryPath.c_str()) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        for( auto name : discoveredDrivers )
        {
            auto handle = LOAD_DRIVER_LIBRARY( name.c_str() );
            if( NULL != handle )
            {
                if (debugTraceEnabled) {
                    std::string message = "Loading Driver " + name + " succeeded";
#if !defined(_WIN32) && !defined(ANDROID)
                    // TODO: implement same message for windows, move dlinfo to ze_util.h as a macro
                    struct link_map *dlinfo_map;
                    if (dlinfo(handle, RTLD_DI_LINKMAP, &dlinfo_map) == 0) {
                        message += " from: " + std::string(dlinfo_map->l_name);
                    }
#endif
                    debug_trace_message(message, "");
                }
                allDrivers.emplace_back();
                allDrivers.rbegin()->handle = handle;
                allDrivers.rbegin()->name = name;
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + name + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }
        if(allDrivers.size()==0){
            if (debugTraceEnabled) {
                std::string message = "0 Drivers Discovered";
                debug_trace_message(message, "");
            }
            zel_logger->log_error("0 Drivers Discovered");
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zeDrivers));
        std::copy(allDrivers.begin(), allDrivers.end(), std::back_inserter(zesDrivers));

        typedef ze_result_t (ZE_APICALL *getVersion_t)(zel_component_version_t *version);
        if( getenv_tobool( "ZE_ENABLE_VALIDATION_LAYER" ) )
        {
            zel_logger->log_info("Validation Layer Enabled");
            std::string validationLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_validation_layer" ), loaderLibraryPath.c_str());
            validationLayer = LOAD_DRIVER_LIBRARY( validationLayerLibraryPath.c_str() );
            if(validationLayer)
            {
                auto getVersion = reinterpret_cast<getVersion_t>(
                    GET_FUNCTION_PTR(validationLayer, "zelLoaderGetVersion"));
                zel_component_version_t compVersion;
                if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
                {   
                    compVersions.push_back(compVersion);
                }
            } else if (debugTraceEnabled) {
                GET_LIBRARY_ERROR(loadLibraryErrorValue);
                std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_validation_layer" )) + " failed with ";
                debug_trace_message(errorMessage, loadLibraryErrorValue);
                loadLibraryErrorValue.clear();
            }
        }

        if (getenv_tobool( "ZE_ENABLE_TRACING_LAYER" )) {
            zel_logger->log_info("Tracing Layer Enabled");
            tracingLayerEnabled = true;
        }
        std::string tracingLayerLibraryPath = create_library_path(MAKE_LAYER_NAME( "ze_tracing_layer" ), loaderLibraryPath.c_str());
        if (debugTraceEnabled)
            debug_trace_message("Tracing Layer Library Path: ", tracingLayerLibraryPath);
        tracingLayer = LOAD_DRIVER_LIBRARY( tracingLayerLibraryPath.c_str() );
        if(tracingLayer)
        {
            auto getVersion = reinterpret_cast<getVersion_t>(
                GET_FUNCTION_PTR(tracingLayer, "zelLoaderGetVersion"));
            zel_component_version_t compVersion;
            if(getVersion && ZE_RESULT_SUCCESS == getVersion(&compVersion))
            {   
                compVersions.push_back(compVersion);
            }
        } else if (debugTraceEnabled) {
            GET_LIBRARY_ERROR(loadLibraryErrorValue);
            std::string errorMessage = "Load Library of " + std::string(MAKE_LAYER_NAME( "ze_tracing_layer" )) + " failed with ";
            debug_trace_message(errorMessage, loadLibraryErrorValue);
            loadLibraryErrorValue.clear();
        }

        if( getenv_tobool( "ZET_ENABLE_API_TRACING_EXP" ) ) {
            auto depr_msg = "ZET_ENABLE_API_TRACING_EXP is deprecated. Use ZE_ENABLE_TRACING_LAYER instead";
            zel_logger->log_warning(depr_msg);
            std::cout << depr_msg << std::endl;
        }

        forceIntercept = getenv_tobool( "ZE_ENABLE_LOADER_INTERCEPT" );

        // Default sysmanInstance Drivers to be the zeDrivers list unless zesInit is called during init.
        sysmanInstanceDrivers = &zeDrivers;

        if(forceIntercept || allDrivers.size() > 1){
             intercept_enabled = true;
             zel_logger->log_info("Intercept Enabled");
        }

        driverEnvironmentQueried = true;

        zel_logger->log_info("zeInit succeeded");
        return ZE_RESULT_SUCCESS;
    }